

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QIconModeViewBase::appendHiddenRow(QIconModeViewBase *this,int row)

{
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((-1 < row) && ((ulong)(uint)row < (ulong)(this->items).d.size)) {
    local_30 = QListViewItem::rect((this->items).d.ptr + (uint)row);
    QBspTree::removeLeaf(&this->tree,&local_30,row);
  }
  QCommonListViewBase::appendHiddenRow(&this->super_QCommonListViewBase,row);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::appendHiddenRow(int row)
{
    if (row >= 0 && row < items.size()) //remove item
        tree.removeLeaf(items.at(row).rect(), row);
    QCommonListViewBase::appendHiddenRow(row);
}